

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_11cad6::GetLoadStoreInfo
                    (VmModule *module,VmValue *loadPointer,VmConstant *loadOffset,uint loadSize,
                    uint accessSize,VmInstructionType loadCmd)

{
  uint uVar1;
  VmValue *pVVar2;
  TypeBase *pTVar3;
  VmInstruction *pVVar4;
  bool bVar5;
  LoadStoreInfo *pLVar6;
  VmValue **ppVVar7;
  ulong uVar8;
  VmConstant *pVVar9;
  uint uVar10;
  int value;
  VmValue *pVVar11;
  uint k;
  VmValueType index;
  uint uVar12;
  Allocator *pAVar13;
  uint uVar14;
  uint uVar15;
  double value_00;
  
  if ((loadPointer == (VmValue *)0x0) || (loadPointer->typeID != 1)) {
    for (uVar12 = 0; uVar12 < (module->loadStoreInfo).count; uVar12 = uVar12 + 1) {
      pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,uVar12);
      pVVar4 = pLVar6->loadInst;
      if ((((pVVar4 != (VmInstruction *)0x0) &&
           (pLVar6->loadPointer == loadPointer && pLVar6->loadPointer != (VmValue *)0x0)) &&
          (pLVar6->loadOffset->iValue == loadOffset->iValue)) && (pLVar6->accessSize == accessSize))
      {
        if (pVVar4->parent != (VmBlock *)0x0) {
          return &pVVar4->super_VmValue;
        }
        __assert_fail("el.loadInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6c7,
                      "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                     );
      }
    }
  }
  else if (loadPointer[1].comment.end != (char *)0x0) {
    if (loadOffset->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x692,
                    "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                   );
    }
    for (uVar12 = 0; uVar12 < (module->loadStoreInfo).count; uVar12 = uVar12 + 1) {
      pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,uVar12);
      if (((pLVar6->loadInst != (VmInstruction *)0x0) && (pLVar6->loadAddress != (VmConstant *)0x0))
         && ((bVar5 = VmConstant::operator==(pLVar6->loadAddress,(VmConstant *)loadPointer), bVar5
             && (pLVar6->accessSize == accessSize)))) {
        if (pLVar6->loadInst->parent != (VmBlock *)0x0) {
          return &pLVar6->loadInst->super_VmValue;
        }
        __assert_fail("el.loadInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x69d,
                      "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                     );
      }
      if ((pLVar6->storeInst == (VmInstruction *)0x0) || (pLVar6->storeAddress == (VmConstant *)0x0)
         ) goto switchD_001a35f6_caseD_1;
      bVar5 = VmConstant::operator==(pLVar6->storeAddress,(VmConstant *)loadPointer);
      if (pLVar6->accessSize == accessSize && bVar5) {
        ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pLVar6->storeInst->arguments,2);
        if (((*ppVVar7)->type).size != loadSize) {
          return (VmValue *)0x0;
        }
        return *ppVVar7;
      }
      if (pLVar6->accessSize < accessSize ||
          pLVar6->storeAddress->container != (VariableData *)loadPointer[1].comment.end)
      goto switchD_001a35f6_caseD_1;
      ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pLVar6->storeInst->arguments,2);
      bVar5 = pLVar6->storeAddress->iValue == 0;
      pVVar11 = *ppVVar7;
      uVar14 = *(uint *)&loadPointer[1]._vptr_VmValue;
      while (((pVVar11 != (VmValue *)0x0 && (pVVar11->typeID == 2)) &&
             (!(bool)(~bVar5 & 1U | 1 < *(int *)&pVVar11[1]._vptr_VmValue - 0x49U)))) {
        uVar15 = 0;
        index = VM_TYPE_VOID;
        do {
          if (pVVar11[1].type.type <= index) goto LAB_001a3559;
          ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&pVVar11[1].typeID,index);
          pVVar2 = *ppVVar7;
          uVar1 = (pVVar2->type).size;
          if (uVar1 == accessSize && uVar14 == uVar15) {
            return pVVar2;
          }
          bVar5 = uVar14 < uVar15;
          uVar10 = uVar14 - uVar15;
          uVar15 = uVar15 + uVar1;
          index = index + VM_TYPE_INT;
        } while (uVar15 < uVar14 + accessSize || bVar5);
        pVVar11 = pVVar2;
        uVar14 = uVar10;
        bVar5 = true;
      }
LAB_001a3559:
      ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pLVar6->storeInst->arguments,2);
      pVVar11 = *ppVVar7;
      if (pVVar11 == (VmValue *)0x0) goto switchD_001a35f6_caseD_1;
      uVar14 = pLVar6->storeAddress->iValue;
      uVar15 = *(uint *)&loadPointer[1]._vptr_VmValue;
      uVar8 = (ulong)(uVar15 - uVar14);
      if (((uVar15 < uVar14) || (pVVar11->typeID != 1)) ||
         (uVar14 + pLVar6->accessSize < uVar15 + accessSize)) goto switchD_001a35f6_caseD_1;
      pTVar3 = pVVar11[1].type.structType;
      if (pTVar3 == (TypeBase *)0x0) {
        __assert_fail("constant->sValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x663,
                      "VmValue *(anonymous namespace)::TryExtractConstant(VmModule *, VmValue *, unsigned int, unsigned int, unsigned int, unsigned int, VmInstructionType)"
                     );
      }
      switch(loadCmd) {
      case VM_INST_LOAD_BYTE:
        pAVar13 = module->allocator;
        value = (int)*(char *)((long)&pTVar3->_vptr_TypeBase + uVar8);
        break;
      default:
        goto switchD_001a35f6_caseD_1;
      case VM_INST_LOAD_INT:
        value = *(int *)((long)&pTVar3->_vptr_TypeBase + uVar8);
        pAVar13 = module->allocator;
        break;
      case VM_INST_LOAD_FLOAT:
        pAVar13 = module->allocator;
        value_00 = (double)*(float *)((long)&pTVar3->_vptr_TypeBase + uVar8);
        goto LAB_001a3632;
      case VM_INST_LOAD_DOUBLE:
        value_00 = *(double *)((long)&pTVar3->_vptr_TypeBase + uVar8);
        pAVar13 = module->allocator;
LAB_001a3632:
        pVVar9 = CreateConstantDouble(pAVar13,(SynBase *)0x0,value_00);
        goto LAB_001a364d;
      case VM_INST_LOAD_LONG:
        pVVar9 = CreateConstantLong(module->allocator,(SynBase *)0x0,
                                    *(longlong *)((long)&pTVar3->_vptr_TypeBase + uVar8));
        goto LAB_001a364d;
      }
      pVVar9 = CreateConstantInt(pAVar13,(SynBase *)0x0,value);
LAB_001a364d:
      if (pVVar9 != (VmConstant *)0x0) {
        return &pVVar9->super_VmValue;
      }
switchD_001a35f6_caseD_1:
    }
  }
  return (VmValue *)0x0;
}

Assistant:

VmValue* GetLoadStoreInfo(VmModule *module, VmValue *loadPointer, VmConstant *loadOffset, unsigned loadSize, unsigned accessSize, VmInstructionType loadCmd)
	{
		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return NULL;

			assert(loadOffset->iValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadAddress)
				{
					if(*el.loadAddress == *loadAddress && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}

				// Reuse store argument
				if(el.storeInst && el.storeAddress)
				{
					if(*el.storeAddress == *loadAddress && accessSize == el.accessSize)
					{
						VmValue *value = el.storeInst->arguments[2];

						// Can't reuse arguments of a different size
						if(value->type.size != loadSize)
							return NULL;

						return value;
					}

					if(el.storeAddress->container == loadAddress->container && accessSize <= el.accessSize)
					{
						if(VmValue *component = TryExtractConstructElement(el.storeInst->arguments[2], el.storeAddress->iValue, loadAddress->iValue, accessSize))
							return component;

						if(VmValue *constant = TryExtractConstant(module, el.storeInst->arguments[2], el.storeAddress->iValue, el.accessSize, loadAddress->iValue, accessSize, loadCmd))
							return constant;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadPointer)
				{
					if(el.loadPointer == loadPointer && el.loadOffset->iValue == loadOffset->iValue && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}
			}
		}

		return NULL;
	}